

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circuit.cpp
# Opt level: O2

int line_x1y1_proc(Am_Object *self)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Am_Value *pAVar5;
  ushort uVar6;
  ushort uVar7;
  Am_Object source_obj;
  
  uVar6 = (ushort)self;
  pAVar5 = (Am_Value *)Am_Object::Get(uVar6,(ulong)INPUT_1);
  Am_Object::Am_Object(&source_obj,pAVar5);
  pAVar5 = (Am_Value *)Am_Object::Get(uVar6,(ulong)INPUT_PLACE);
  iVar1 = Am_Value::operator_cast_to_int(pAVar5);
  iVar2 = 0;
  if (iVar1 == 3) {
    uVar7 = (ushort)&source_obj;
    pAVar5 = (Am_Value *)Am_Object::Get(uVar7,0x66);
    iVar1 = Am_Value::operator_cast_to_int(pAVar5);
    pAVar5 = (Am_Value *)Am_Object::Get(uVar7,100);
    iVar2 = Am_Value::operator_cast_to_int(pAVar5);
    pAVar5 = (Am_Value *)Am_Object::Get(uVar7,0x67);
    iVar3 = Am_Value::operator_cast_to_int(pAVar5);
    pAVar5 = (Am_Value *)Am_Object::Get(uVar7,0x65);
    iVar4 = Am_Value::operator_cast_to_int(pAVar5);
    Am_Object::Set(uVar6,0x8c,(ulong)(uint)(iVar4 + iVar3 / 2));
    iVar2 = iVar1 + iVar2 + -2;
  }
  Am_Object::~Am_Object(&source_obj);
  return iVar2;
}

Assistant:

Am_Define_Formula(int, line_x1y1) {
  Am_Object source_obj = self.Get(INPUT_1);
  Places where = (Places)(int)self.Get(INPUT_PLACE);
  if (where == center_right) {
    int x1 = (int)source_obj.Get(Am_WIDTH) + (int)source_obj.Get(Am_LEFT)-2;
    int y1 = (int)source_obj.Get(Am_HEIGHT) / 2 + (int)source_obj.Get(Am_TOP);
    self.Set(Am_Y1, y1);
    return x1;
  }
  return 0;
}